

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNode(Impl *this,Reader node)

{
  size_t size_00;
  word *__s;
  size_t in_RCX;
  MessageSize MVar1;
  ArrayPtr<capnp::word> uncheckedBuffer;
  size_t size;
  Impl *this_local;
  ArrayPtr<capnp::word> result;
  
  MVar1 = capnp::schema::Node::Reader::totalSize(&node);
  size_00 = MVar1.wordCount + 1;
  _this_local = kj::Arena::allocateArray<capnp::word>(&this->arena,size_00);
  __s = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
  memset(__s,0,size_00 * 8);
  uncheckedBuffer.size_ = in_RCX;
  uncheckedBuffer.ptr = result.ptr;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&node,(Reader *)this_local,uncheckedBuffer)
  ;
  return _this_local;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNode(schema::Node::Reader node) {
  size_t size = node.totalSize().wordCount + 1;
  kj::ArrayPtr<word> result = arena.allocateArray<word>(size);
  memset(result.begin(), 0, size * sizeof(word));
  copyToUnchecked(node, result);
  return result;
}